

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ewmh.c
# Opt level: O3

_Bool ewmh_is_normal_window(natwm_state *state,xcb_window_t window)

{
  char cVar1;
  undefined4 uVar2;
  long lVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  _Bool _Var4;
  bool bVar5;
  undefined8 uVar6;
  uint local_30 [2];
  xcb_ewmh_get_atoms_reply_t result;
  
  uVar6 = 0x107ef6;
  uVar2 = xcb_ewmh_get_wm_window_type(state->ewmh,window);
  cVar1 = xcb_ewmh_get_wm_window_type_reply(state->ewmh,uVar2,local_30,0,in_R8,in_R9,uVar6);
  _Var4 = true;
  if (cVar1 == '\x01') {
    if ((ulong)local_30[0] != 0) {
      lVar3 = 0;
      do {
        _Var4 = *(xcb_atom_t *)(result._0_8_ + lVar3 * 4) == state->ewmh->_NET_WM_WINDOW_TYPE_NORMAL
        ;
        if (!_Var4) break;
        bVar5 = (ulong)local_30[0] - 1 != lVar3;
        lVar3 = lVar3 + 1;
      } while (bVar5);
    }
    xcb_ewmh_get_atoms_reply_wipe(local_30);
  }
  return _Var4;
}

Assistant:

bool ewmh_is_normal_window(const struct natwm_state *state, xcb_window_t window)
{
        xcb_get_property_cookie_t cookie = xcb_ewmh_get_wm_window_type(state->ewmh, window);
        xcb_ewmh_get_atoms_reply_t result;
        uint8_t reply = xcb_ewmh_get_wm_window_type_reply(state->ewmh, cookie, &result, NULL);

        if (reply != 1) {
                // Treat as a normal window
                return true;
        }

        for (size_t i = 0; i < result.atoms_len; ++i) {
                xcb_atom_t type = result.atoms[i];

                // For now we only support normal windows for registering
                if (type != state->ewmh->_NET_WM_WINDOW_TYPE_NORMAL) {
                        xcb_ewmh_get_atoms_reply_wipe(&result);

                        return false;
                }
        }

        xcb_ewmh_get_atoms_reply_wipe(&result);

        return true;
}